

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O1

ON_3dVector * __thiscall
ON_SubDVertex::SurfaceNormal
          (ON_3dVector *__return_storage_ptr__,ON_SubDVertex *this,ON_SubDFace *sector_face,
          bool bUndefinedNormalPossible)

{
  double dVar1;
  bool bVar2;
  ON_SubDEdge *pOVar3;
  ON_SubDEdge *pOVar4;
  char *sFormat;
  int line_number;
  ON_SubDSectorSurfacePoint limit_point;
  ON_SubDComponentPtr local_a8;
  ON_SubDComponentPtr local_a0;
  ON_SubDSectorSurfacePoint local_98;
  
  if ((this->m_face_count == 0) || (this->m_faces == (ON_SubDFace **)0x0)) {
    sFormat = "No faces on this vertex.";
    line_number = 0x2ab;
LAB_0060cccf:
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd_eval.cpp"
               ,line_number,"",sFormat);
  }
  else {
    if (sector_face == (ON_SubDFace *)0x0) {
      bVar2 = IsCreaseOrCorner(this);
      if (bVar2) {
        local_98.m_limitP._0_16_ = CreasedEdgePair(this,false);
        local_a0 = ON_SubDComponentPtrPair::First((ON_SubDComponentPtrPair *)&local_98);
        pOVar3 = ON_SubDComponentPtr::Edge(&local_a0);
        local_a8 = ON_SubDComponentPtrPair::Second((ON_SubDComponentPtrPair *)&local_98);
        pOVar4 = ON_SubDComponentPtr::Edge(&local_a8);
        if ((((pOVar3 == (ON_SubDEdge *)0x0) || (pOVar4 == (ON_SubDEdge *)0x0)) ||
            (pOVar3->m_face_count != 1)) || (pOVar4->m_face_count != 1)) {
          sFormat = "sector_face must be specified in this case.";
          line_number = 0x2b5;
          goto LAB_0060cccf;
        }
      }
      sector_face = *this->m_faces;
    }
    bVar2 = GetSurfacePoint(this,sector_face,bUndefinedNormalPossible,&local_98);
    if (bVar2) {
      ON_3dVector::ON_3dVector
                (__return_storage_ptr__,
                 (double *)((long)((ON_SubDComponentPtr (*) [2])&local_98 + 4) + 8));
      if (bUndefinedNormalPossible) {
        return __return_storage_ptr__;
      }
      bVar2 = ON_3dVector::IsZero(__return_storage_ptr__);
      if (!bVar2) {
        return __return_storage_ptr__;
      }
    }
  }
  __return_storage_ptr__->z = ON_3dVector::NanVector.z;
  dVar1 = ON_3dVector::NanVector.y;
  __return_storage_ptr__->x = ON_3dVector::NanVector.x;
  __return_storage_ptr__->y = dVar1;
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDVertex::SurfaceNormal(
  const ON_SubDFace* sector_face,
  bool bUndefinedNormalPossible
) const
{
  for (;;)
  {
    if (m_face_count < 1 || nullptr == m_faces)
    {
      ON_ERROR("No faces on this vertex.");
      break;
    }

    if (nullptr == sector_face && IsCreaseOrCorner())
    {
      const ON_SubDComponentPtrPair crease_pair = this->CreasedEdgePair(false);
      const ON_SubDEdge* e[2] = { crease_pair.First().Edge(), crease_pair.Second().Edge() };
      if (nullptr == e[0] || 1 != e[0]->m_face_count || nullptr == e[1] || 1 != e[1]->m_face_count)
      {
        ON_ERROR("sector_face must be specified in this case.");
        break;
      }
    }

    if (nullptr == sector_face)
      sector_face = m_faces[0];
    ON_SubDSectorSurfacePoint limit_point;
    bool rc = ON_SubDVertex::GetSurfacePoint(
      sector_face,
      bUndefinedNormalPossible,
      limit_point
    );
    if (false == rc)
      break;
    const ON_3dVector N(limit_point.m_limitN);
    if (false == bUndefinedNormalPossible && N.IsZero())
      break;
    return N;
  }

  return ON_3dVector::NanVector;
}